

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qkeysequenceedit.cpp
# Opt level: O1

void QKeySequenceEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QArrayData *pQVar2;
  long lVar3;
  bool bVar4;
  QArrayDataPointer<QKeyCombination> *pQVar5;
  int iVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QKeyCombination> local_58;
  long local_38;
  
  pQVar5 = &local_58;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    iVar6 = 0;
    pQVar5 = (QArrayDataPointer<QKeyCombination> *)0x0;
    goto LAB_00414e13;
  case 1:
    local_58.ptr = (QKeyCombination *)_a[1];
    local_58.d = (Data *)0x0;
    iVar6 = 1;
LAB_00414e13:
    QMetaObject::activate(_o,&staticMetaObject,iVar6,&pQVar5->d);
    break;
  case 2:
    setKeySequence((QKeySequenceEdit *)_o,(QKeySequence *)_a[1]);
    break;
  case 3:
    clear((QKeySequenceEdit *)_o);
    break;
  case 4:
    setMaximumSequenceLength((QKeySequenceEdit *)_o,*_a[1]);
  }
  if (_c == ReadProperty) {
switchD_00414d94_caseD_1:
    if ((uint)_id < 4) {
      pQVar5 = (QArrayDataPointer<QKeyCombination> *)*_a;
      switch(_id) {
      case 0:
        QKeySequence::QKeySequence
                  ((QKeySequence *)&local_58,(QKeySequence *)(*(long *)(_o + 8) + 0x260));
        pQVar2 = &pQVar5->d->super_QArrayData;
        pQVar5->d = local_58.d;
        local_58.d = (Data *)pQVar2;
        QKeySequence::~QKeySequence((QKeySequence *)&local_58);
        break;
      case 1:
        bVar4 = QLineEdit::isClearButtonEnabled(*(QLineEdit **)(*(long *)(_o + 8) + 600));
        *(bool *)&pQVar5->d = bVar4;
        break;
      case 2:
        pQVar5->d = (Data *)(long)*(int *)(*(long *)(_o + 8) + 0x26c);
        break;
      case 3:
        lVar3 = *(long *)(_o + 8);
        local_58.d = *(Data **)(lVar3 + 0x288);
        local_58.ptr = *(QKeyCombination **)(lVar3 + 0x290);
        local_58.size = *(qsizetype *)(lVar3 + 0x298);
        if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QArrayDataPointer<QKeyCombination>::operator=(pQVar5,&local_58);
        if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d)->super_QArrayData,4,0x10);
          }
        }
      }
    }
    if (_c != WriteProperty) goto switchD_00414d94_caseD_3;
  }
  else if (_c != WriteProperty) {
    if (_c != IndexOfMethod) goto switchD_00414d94_caseD_3;
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == editingFinished) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_00414d94_caseD_3;
    }
    if (((code *)*plVar1 == keySequenceChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_00414d94_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_00414d94_caseD_3;
      goto switchD_00414d94_caseD_1;
    }
  }
  if ((uint)_id < 4) {
    pQVar5 = (QArrayDataPointer<QKeyCombination> *)*_a;
    switch(_id) {
    case 0:
      setKeySequence((QKeySequenceEdit *)_o,(QKeySequence *)pQVar5);
      break;
    case 1:
      QLineEdit::setClearButtonEnabled(*(QLineEdit **)(*(long *)(_o + 8) + 600),*(bool *)&pQVar5->d)
      ;
      break;
    case 2:
      setMaximumSequenceLength((QKeySequenceEdit *)_o,(qsizetype)pQVar5->d);
      break;
    case 3:
      QArrayDataPointer<QKeyCombination>::operator=
                ((QArrayDataPointer<QKeyCombination> *)(*(long *)(_o + 8) + 0x288),pQVar5);
    }
  }
switchD_00414d94_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QKeySequenceEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QKeySequenceEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->editingFinished(); break;
        case 1: _t->keySequenceChanged((*reinterpret_cast< std::add_pointer_t<QKeySequence>>(_a[1]))); break;
        case 2: _t->setKeySequence((*reinterpret_cast< std::add_pointer_t<QKeySequence>>(_a[1]))); break;
        case 3: _t->clear(); break;
        case 4: _t->setMaximumSequenceLength((*reinterpret_cast< std::add_pointer_t<qsizetype>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QKeySequenceEdit::*)()>(_a, &QKeySequenceEdit::editingFinished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QKeySequenceEdit::*)(const QKeySequence & )>(_a, &QKeySequenceEdit::keySequenceChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QKeySequence*>(_v) = _t->keySequence(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isClearButtonEnabled(); break;
        case 2: *reinterpret_cast<qsizetype*>(_v) = _t->maximumSequenceLength(); break;
        case 3: *reinterpret_cast<QList<QKeyCombination>*>(_v) = _t->finishingKeyCombinations(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setKeySequence(*reinterpret_cast<QKeySequence*>(_v)); break;
        case 1: _t->setClearButtonEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setMaximumSequenceLength(*reinterpret_cast<qsizetype*>(_v)); break;
        case 3: _t->setFinishingKeyCombinations(*reinterpret_cast<QList<QKeyCombination>*>(_v)); break;
        default: break;
        }
    }
}